

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_cli.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  char *pcVar1;
  Location location;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  TokenMatcher *token_matcher;
  IdGenerator *id_generator;
  Builder *builder;
  Parser *parser;
  Compiler *compiler;
  FileReader *file_reader;
  wchar_t *source;
  SourceEvent *event;
  TokenScanner *token_scanner;
  Error *error;
  ErrorEvent *error_event;
  GherkinDocument *gherkin_document;
  GherkinDocumentEvent *event_00;
  Pickle *pickle;
  PickleEvent *event_01;
  wchar_t wVar9;
  ulong uVar10;
  
  setlocale(6,"en_US.UTF-8");
  if (argc < L'\x02') {
    bVar4 = true;
    bVar2 = false;
    bVar3 = false;
  }
  else {
    bVar3 = true;
    uVar10 = 1;
    bVar2 = true;
    bVar4 = true;
    do {
      pcVar1 = argv[uVar10];
      iVar6 = strcmp("--no-source",pcVar1);
      if (iVar6 == 0) {
        bVar4 = false;
      }
      else {
        iVar6 = strcmp("--no-ast",pcVar1);
        if (iVar6 == 0) {
          bVar2 = false;
        }
        else {
          iVar6 = strcmp("--no-pickles",pcVar1);
          if (iVar6 == 0) {
            bVar3 = false;
          }
          else if (*pcVar1 == '-') {
            iVar6 = strcmp("-h",pcVar1);
            if ((iVar6 != 0) && (iVar6 = strcmp("--help",pcVar1), iVar6 != 0)) {
              fprintf(_stdout,"Unknown option: %s\n\n",pcVar1);
            }
            fwrite("Usage: gherkin [options] FILE*\n",0x1f,1,_stdout);
            fwrite("        -h, --help                             You\'re looking at it.\n",0x45,1,
                   _stdout);
            fwrite("        --no-ast                               Do not emit Ast events.\n",0x47,1
                   ,_stdout);
            fwrite("        --no-pickles                           Do not emit Pickle events.\n",
                   0x4a,1,_stdout);
            fwrite("        --no-source                            Do not emit Source events.\n",
                   0x4a,1,_stdout);
            exit(0);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uint)argc != uVar10);
    bVar2 = !bVar2;
    bVar3 = !bVar3;
  }
  wVar9 = L'\0';
  token_matcher = TokenMatcher_new(L"en");
  id_generator = IncrementingIdGenerator_new();
  builder = AstBuilder_new(id_generator);
  parser = Parser_new(builder);
  compiler = Compiler_new(id_generator);
  if (L'\x01' < argc) {
    wVar9 = L'\0';
    uVar10 = 1;
    do {
      if (*argv[uVar10] != '-') {
        file_reader = FileReader_new(argv[uVar10]);
        pcVar1 = argv[uVar10];
        source = FileReader_read(file_reader);
        event = SourceEvent_new(pcVar1,source);
        FileReader_delete(file_reader);
        if (bVar4) {
          Event_print(&event->event,(FILE *)_stdout);
        }
        token_scanner = StringTokenScanner_new(event->source);
        wVar7 = Parser_parse(parser,token_matcher,token_scanner);
        if (wVar7 == L'\0') {
          gherkin_document = AstBuilder_get_result(builder,argv[uVar10]);
          event_00 = GherkinDocumentEvent_new(gherkin_document);
          if (!bVar2) {
            Event_print(&event_00->event,(FILE *)_stdout);
          }
          wVar8 = Compiler_compile(compiler,event_00->gherkin_document,event->source);
          Event_delete(&event_00->event);
          wVar7 = wVar8;
          if (wVar8 == L'\0') {
            wVar7 = wVar9;
          }
          if ((wVar8 == L'\0' && !bVar3) &&
             (_Var5 = Compiler_has_more_pickles(compiler), wVar7 = wVar9, _Var5)) {
            do {
              pickle = Compiler_next_pickle(compiler);
              event_01 = PickleEvent_new(pickle);
              Event_print(&event_01->event,(FILE *)_stdout);
              Event_delete(&event_01->event);
              _Var5 = Compiler_has_more_pickles(compiler);
            } while (_Var5);
          }
        }
        else {
          _Var5 = Parser_has_more_errors(parser);
          if (_Var5) {
            do {
              error = Parser_next_error(parser);
              location.line = (error->location).line;
              location.column = (error->location).column;
              error_event = ErrorEvent_new(argv[uVar10],location);
              ErrorEvent_transfer_error_text(error_event,error);
              Event_print(&error_event->event,(FILE *)_stdout);
              Event_delete(&error_event->event);
              Error_delete(error);
              _Var5 = Parser_has_more_errors(parser);
            } while (_Var5);
          }
        }
        wVar9 = wVar7;
        TokenScanner_delete(token_scanner);
        Event_delete(&event->event);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)argc);
  }
  Compiler_delete(compiler);
  Parser_delete(parser);
  AstBuilder_delete(builder);
  (*id_generator->id_generator_delete)(id_generator);
  TokenMatcher_delete(token_matcher);
  return wVar9;
}

Assistant:

int main(int argc, char** argv) {
    setlocale(LC_ALL, "en_US.UTF-8");
    Options options = parse_options(argc, argv);
    TokenMatcher* token_matcher = TokenMatcher_new(L"en");
    IdGenerator* id_generator = IncrementingIdGenerator_new();
    Builder* builder = AstBuilder_new(id_generator);
    Parser* parser = Parser_new(builder);
    Compiler* compiler = Compiler_new(id_generator);
    int return_code = 0;
    int result_code = 0;
    int i;
    for (i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            continue;
        }
        FileReader* file_reader = FileReader_new(argv[i]);
        SourceEvent* source_event = SourceEvent_new(argv[i], FileReader_read(file_reader));
        FileReader_delete(file_reader);
        if (options.print_source_events) {
            Event_print((const Event*)source_event, stdout);
        }
        TokenScanner* token_scanner = StringTokenScanner_new(source_event->source);
        result_code = Parser_parse(parser, token_matcher, token_scanner);
        if (result_code == 0) {
            const GherkinDocumentEvent* gherkin_document_event = GherkinDocumentEvent_new(AstBuilder_get_result(builder, argv[i]));
            if (options.print_ast_events) {
                Event_print((const Event*)gherkin_document_event, stdout);
            }
            result_code = Compiler_compile(compiler, gherkin_document_event->gherkin_document, source_event->source);
            Event_delete((const Event*)gherkin_document_event);
            if (result_code == 0) {
                if (options.print_pickle_events) {
                    while (Compiler_has_more_pickles(compiler)) {
                        const Event* pickle_event = (const Event*)PickleEvent_new(Compiler_next_pickle(compiler));
                        Event_print(pickle_event, stdout);
                        Event_delete(pickle_event);
                    }
                }
            }
            else {
                return_code = result_code;
            }
        }
        else {
            return_code = result_code;
            while (Parser_has_more_errors(parser)) {
                Error* error = Parser_next_error(parser);
                ErrorEvent* error_event = ErrorEvent_new(argv[i], error->location);
                ErrorEvent_transfer_error_text(error_event, error);
                Event_print((Event*)error_event, stdout);
                Event_delete((Event*)error_event);
                Error_delete(error);
            }
        }
        TokenScanner_delete(token_scanner);
        Event_delete((const Event*)source_event);
    }
    Compiler_delete(compiler);
    Parser_delete(parser);
    AstBuilder_delete(builder);
    id_generator->id_generator_delete(id_generator);
    TokenMatcher_delete(token_matcher);
    return return_code;
}